

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

void __thiscall TTD::EventLog::SetModeFlagsOnContext(EventLog *this,ScriptContext *ctx)

{
  TTDMode TVar1;
  bool bVar2;
  bool bVar3;
  
  TVar1 = this->m_currentMode;
  bVar2 = (TVar1 & (AnyExcludedMode|RecordMode)) == RecordMode;
  ctx->TTDRecordModeEnabled = bVar2;
  bVar3 = (TVar1 & (AnyExcludedMode|ReplayMode)) == ReplayMode;
  ctx->TTDReplayModeEnabled = bVar3;
  ctx->TTDRecordOrReplayModeEnabled = bVar3 || bVar2;
  bVar2 = (TVar1 & (AnyExcludedMode|RecordMode|CurrentlyEnabled)) == (RecordMode|CurrentlyEnabled);
  ctx->TTDShouldPerformRecordAction = bVar2;
  bVar3 = (TVar1 & (AnyExcludedMode|ReplayMode|CurrentlyEnabled)) == (ReplayMode|CurrentlyEnabled);
  ctx->TTDShouldPerformReplayAction = bVar3;
  ctx->TTDShouldPerformRecordOrReplayAction = bVar3 || bVar2;
  bVar2 = (TVar1 & (AnyExcludedMode|RecordDebuggerMode|CurrentlyEnabled)) ==
          (RecordDebuggerMode|CurrentlyEnabled);
  ctx->TTDShouldPerformRecordDebuggerAction = bVar2;
  bVar3 = (TVar1 & (AnyExcludedMode|ReplayDebuggerMode|CurrentlyEnabled)) ==
          (ReplayDebuggerMode|CurrentlyEnabled);
  ctx->TTDShouldPerformReplayDebuggerAction = bVar3;
  ctx->TTDShouldPerformRecordOrReplayDebuggerAction = bVar3 || bVar2;
  ctx->TTDShouldSuppressGetterInvocationForDebuggerEvaluation = (bool)((byte)(TVar1 >> 9) & 1);
  return;
}

Assistant:

void EventLog::SetModeFlagsOnContext(Js::ScriptContext* ctx)
    {
        TTDMode cm = this->m_currentMode;

        ctx->TTDRecordModeEnabled = (cm & (TTDMode::RecordMode | TTDMode::AnyExcludedMode)) == TTDMode::RecordMode;
        ctx->TTDReplayModeEnabled = (cm & (TTDMode::ReplayMode | TTDMode::AnyExcludedMode)) == TTDMode::ReplayMode;
        ctx->TTDRecordOrReplayModeEnabled = (ctx->TTDRecordModeEnabled | ctx->TTDReplayModeEnabled);

        ctx->TTDShouldPerformRecordAction = (cm & (TTDMode::RecordMode | TTDMode::CurrentlyEnabled | TTDMode::AnyExcludedMode)) == (TTDMode::RecordMode | TTDMode::CurrentlyEnabled);
        ctx->TTDShouldPerformReplayAction = (cm & (TTDMode::ReplayMode | TTDMode::CurrentlyEnabled | TTDMode::AnyExcludedMode)) == (TTDMode::ReplayMode | TTDMode::CurrentlyEnabled);
        ctx->TTDShouldPerformRecordOrReplayAction = (ctx->TTDShouldPerformRecordAction | ctx->TTDShouldPerformReplayAction);

        ctx->TTDShouldPerformRecordDebuggerAction = (cm & (TTDMode::RecordDebuggerMode | TTDMode::CurrentlyEnabled | TTDMode::AnyExcludedMode)) == (TTDMode::RecordDebuggerMode | TTDMode::CurrentlyEnabled);
        ctx->TTDShouldPerformReplayDebuggerAction = (cm & ( TTDMode::ReplayDebuggerMode | TTDMode::CurrentlyEnabled | TTDMode::AnyExcludedMode)) == (TTDMode::ReplayDebuggerMode | TTDMode::CurrentlyEnabled);
        ctx->TTDShouldPerformRecordOrReplayDebuggerAction = (ctx->TTDShouldPerformRecordDebuggerAction | ctx->TTDShouldPerformReplayDebuggerAction);

        ctx->TTDShouldSuppressGetterInvocationForDebuggerEvaluation = (cm & TTDMode::DebuggerSuppressGetter) == TTDMode::DebuggerSuppressGetter;
    }